

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O1

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenBracket(Lexer *this)

{
  char cVar1;
  Token *this_00;
  TokenType type;
  Lexer *in_RSI;
  Token *last;
  string local_40;
  
  cVar1 = (char)in_RSI->currentChar;
  nextChar(in_RSI);
  if (cVar1 == '}') {
    getCurrentCursor((Position *)&local_40,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    last = in_RSI->currentToken;
    type = TOK_TEMPL_BRACKET_CLOSE;
  }
  else if (cVar1 == ']') {
    getCurrentCursor((Position *)&local_40,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    last = in_RSI->currentToken;
    type = TOK_ARR_BRACKET_CLOSE;
  }
  else {
    if (cVar1 != ')') {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"Unexpected branch reached","");
      fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_lexer/src/lexer_next.cpp"
            ,0x232,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      this->_vptr_Lexer = (_func_int **)0x0;
      return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
             (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
    }
    getCurrentCursor((Position *)&local_40,in_RSI);
    this_00 = (Token *)operator_new(0x30);
    last = in_RSI->currentToken;
    type = TOK_BRACKET_CLOSE;
  }
  Token::Token(this_00,last,type,(Position *)&local_40);
  this->_vptr_Lexer = (_func_int **)this_00;
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenBracket() noexcept {
  const char c = currentChar;
  nextChar(); // eat bracket
  switch (c) {
  case ')':
    return std::make_unique<Token>(currentToken, TokenType::TOK_BRACKET_CLOSE, getCurrentCursor());
  case ']':
    return std::make_unique<Token>(currentToken, TokenType::TOK_ARR_BRACKET_CLOSE, getCurrentCursor());
  case '}':
    return std::make_unique<Token>(currentToken, TokenType::TOK_TEMPL_BRACKET_CLOSE, getCurrentCursor());
  default:
    fatal(__FILE__, __LINE__, "Unexpected branch reached");
    return nullptr;
  }
}